

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall tcu::TextureCube::allocLevel(TextureCube *this,CubeFace face,int levelNdx)

{
  TextureFormat *pTVar1;
  pointer pPVar2;
  int iVar3;
  int width;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  width = this->m_size >> ((byte)levelNdx & 0x1f);
  if (width < 2) {
    width = 1;
  }
  iVar3 = TextureFormat::getPixelSize(&this->m_format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (this->m_data[face].
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx,(long)(iVar3 * width * width));
  ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_58,&this->m_format,width,width,1,
             this->m_data[face].
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[levelNdx].m_ptr);
  pPVar2 = this->m_access[face].
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(void **)((long)(pPVar2 + levelNdx) + 0x20) = local_38;
  *(undefined8 *)((long)(pPVar2 + levelNdx) + 0x10) = local_58._16_8_;
  *(int (*) [2])((long)(pPVar2 + levelNdx) + 0x18) = aiStack_40;
  pTVar1 = (TextureFormat *)(pPVar2 + levelNdx);
  pTVar1->order = local_58._0_4_;
  pTVar1->type = local_58._4_4_;
  pTVar1[1].order = local_58._8_4_;
  pTVar1[1].type = local_58._12_4_;
  return;
}

Assistant:

void TextureCube::allocLevel (tcu::CubeFace face, int levelNdx)
{
	const int	size		= getMipPyramidLevelSize(m_size, levelNdx);
	const int	dataSize	= m_format.getPixelSize()*size*size;
	DE_ASSERT(isLevelEmpty(face, levelNdx));

	m_data[face][levelNdx].setStorage(dataSize);
	m_access[face][levelNdx] = PixelBufferAccess(m_format, size, size, 1, m_data[face][levelNdx].getPtr());
}